

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint color_tree_add(ColorTree *tree,uchar r,uchar g,uchar b,uchar a,uint index)

{
  uint uVar1;
  bool bVar2;
  ColorTree *pCVar3;
  byte bVar4;
  undefined7 in_register_00000009;
  undefined3 in_register_00000011;
  uint uVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  ulong uVar7;
  undefined3 in_register_00000081;
  undefined1 auVar8 [16];
  
  uVar6 = CONCAT71(in_register_00000031,r);
  uVar5 = 0;
  uVar7 = uVar6;
  do {
    bVar4 = (byte)uVar5;
    uVar1 = (uint)((CONCAT31(in_register_00000081,a) >> (uVar5 & 0x1f) & 1) != 0) +
            (CONCAT31(in_register_00000011,g) >> (bVar4 & 0x1f) & 1) * 4 +
            ((uint)uVar7 >> (bVar4 & 0x1f) & 1) * 8 +
            ((uint)CONCAT71(in_register_00000009,b) >> (bVar4 & 0x1f) & 1) * 2;
    if (tree->children[uVar1] == (ColorTree *)0x0) {
      pCVar3 = (ColorTree *)malloc(0x88);
      tree->children[uVar1] = pCVar3;
      if (pCVar3 != (ColorTree *)0x0) {
        auVar8 = ZEXT816(0) << 0x40;
        *(undefined1 (*) [32])(pCVar3->children + 0xc) = ZEXT1632(auVar8);
        *(undefined1 (*) [32])(pCVar3->children + 8) = ZEXT1632(auVar8);
        *(undefined1 (*) [32])(pCVar3->children + 4) = ZEXT1632(auVar8);
        *(undefined1 (*) [32])pCVar3->children = ZEXT1632(auVar8);
        pCVar3->index = -1;
        uVar7 = uVar6 & 0xffffffff;
        goto LAB_0012a9e2;
      }
      bVar2 = false;
      uVar7 = uVar6 & 0xffffffff;
    }
    else {
LAB_0012a9e2:
      tree = tree->children[uVar1];
      bVar2 = true;
    }
    if (!bVar2) {
      return 0x53;
    }
    uVar5 = uVar5 + 1;
    if (uVar5 == 8) {
      tree->index = index;
      return 0;
    }
  } while( true );
}

Assistant:

static unsigned color_tree_add(ColorTree* tree,
  unsigned char r, unsigned char g, unsigned char b, unsigned char a, unsigned index) {
  int bit;
  for (bit = 0; bit < 8; ++bit) {
    int i = 8 * ((r >> bit) & 1) + 4 * ((g >> bit) & 1) + 2 * ((b >> bit) & 1) + 1 * ((a >> bit) & 1);
    if (!tree->children[i]) {
      tree->children[i] = (ColorTree*)lodepng_malloc(sizeof(ColorTree));
      if (!tree->children[i]) return 83; /*alloc fail*/
      color_tree_init(tree->children[i]);
    }
    tree = tree->children[i];
  }
  tree->index = (int)index;
  return 0;
}